

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O1

DisasJumpType op_vsldb(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  TCGContext_conflict12 *s_00;
  uint8_t enr;
  TCGTemp *pTVar2;
  uint uVar3;
  TCGv_i64 dst;
  uintptr_t o_2;
  TCGv_i64 dst_00;
  uintptr_t o_1;
  TCGv_i64 dst_01;
  
  if (((s->fields).presentO & 0x100000) == 0) goto LAB_00cda22b;
  s_00 = s->uc->tcg_ctx;
  uVar3 = (s->fields).c[3];
  pTVar2 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
  dst_01 = (TCGv_i64)((long)pTVar2 - (long)s_00);
  pTVar2 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
  dst_00 = (TCGv_i64)((long)pTVar2 - (long)s_00);
  pTVar2 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
  uVar1 = (s->fields).presentO;
  if ((uVar3 & 8) == 0) {
    if ((uVar1 >> 0x17 & 1) == 0) goto LAB_00cda22b;
    read_vec_element_i64(s_00,dst_01,(uint8_t)(s->fields).c[6],'\0',MO_64);
    if (((s->fields).presentO & 0x800000) == 0) goto LAB_00cda22b;
    read_vec_element_i64(s_00,dst_00,(uint8_t)(s->fields).c[6],'\x01',MO_64);
    if (((s->fields).presentO & 0x1000000) == 0) goto LAB_00cda22b;
    enr = '\0';
  }
  else {
    if ((uVar1 >> 0x17 & 1) == 0) goto LAB_00cda22b;
    read_vec_element_i64(s_00,dst_01,(uint8_t)(s->fields).c[6],'\x01',MO_64);
    if (((s->fields).presentO & 0x1000000) == 0) goto LAB_00cda22b;
    read_vec_element_i64(s_00,dst_00,(uint8_t)(s->fields).c[2],'\0',MO_64);
    enr = '\x01';
    if (((s->fields).presentO & 0x1000000) == 0) goto LAB_00cda22b;
  }
  dst = (TCGv_i64)((long)pTVar2 - (long)s_00);
  read_vec_element_i64(s_00,dst,(uint8_t)(s->fields).c[2],enr,MO_64);
  uVar3 = (uVar3 & 7) * -8 + 0x40;
  tcg_gen_extract2_i64_s390x(s_00,dst_01,dst_00,dst_01,uVar3);
  tcg_gen_extract2_i64_s390x(s_00,dst_00,dst,dst_00,uVar3);
  if (((s->fields).presentO & 0x400000) != 0) {
    write_vec_element_i64(s_00,dst_01,(s->fields).c[0],'\0',MO_64);
    if (((s->fields).presentO & 0x400000) != 0) {
      write_vec_element_i64(s_00,dst_00,(s->fields).c[0],'\x01',MO_64);
      tcg_temp_free_internal_s390x(s_00,(TCGTemp *)(dst_01 + (long)s_00));
      tcg_temp_free_internal_s390x(s_00,(TCGTemp *)(dst_00 + (long)s_00));
      tcg_temp_free_internal_s390x(s_00,(TCGTemp *)(dst + (long)s_00));
      return DISAS_NEXT;
    }
  }
LAB_00cda22b:
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vsldb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t i4 = get_field(s, i4) & 0xf;
    const int left_shift = (i4 & 7) * 8;
    const int right_shift = 64 - left_shift;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

    if ((i4 & 8) == 0) {
        read_vec_element_i64(tcg_ctx, t0, get_field(s, v2), 0, ES_64);
        read_vec_element_i64(tcg_ctx, t1, get_field(s, v2), 1, ES_64);
        read_vec_element_i64(tcg_ctx, t2, get_field(s, v3), 0, ES_64);
    } else {
        read_vec_element_i64(tcg_ctx, t0, get_field(s, v2), 1, ES_64);
        read_vec_element_i64(tcg_ctx, t1, get_field(s, v3), 0, ES_64);
        read_vec_element_i64(tcg_ctx, t2, get_field(s, v3), 1, ES_64);
    }
    tcg_gen_extract2_i64(tcg_ctx, t0, t1, t0, right_shift);
    tcg_gen_extract2_i64(tcg_ctx, t1, t2, t1, right_shift);
    write_vec_element_i64(tcg_ctx, t0, get_field(s, v1), 0, ES_64);
    write_vec_element_i64(tcg_ctx, t1, get_field(s, v1), 1, ES_64);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
    return DISAS_NEXT;
}